

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O2

void __thiscall Assimp::D3MF::D3MFExporter::writeObjects(D3MFExporter *this)

{
  ostringstream *poVar1;
  aiNode *paVar2;
  aiNode *paVar3;
  aiMesh *mesh;
  ostream *poVar4;
  uint j;
  ulong uVar5;
  uint local_3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  paVar2 = this->mScene->mRootNode;
  if (paVar2 != (aiNode *)0x0) {
    poVar1 = &this->mModelOutput;
    local_38 = &this->mBuildItems;
    for (local_3c = 0; local_3c < paVar2->mNumChildren; local_3c = local_3c + 1) {
      paVar3 = paVar2->mChildren[local_3c];
      if (paVar3 != (aiNode *)0x0) {
        poVar4 = std::operator<<((ostream *)poVar1,"<");
        poVar4 = std::operator<<(poVar4,(string *)XmlTag::object_abi_cxx11_);
        poVar4 = std::operator<<(poVar4," id=\"");
        poVar4 = std::operator<<(poVar4,(paVar3->mName).data);
        std::operator<<(poVar4,"\" type=\"model\">");
        std::endl<char,std::char_traits<char>>((ostream *)poVar1);
        for (uVar5 = 0; uVar5 < paVar3->mNumMeshes; uVar5 = uVar5 + 1) {
          mesh = this->mScene->mMeshes[paVar3->mMeshes[uVar5]];
          if (mesh != (aiMesh *)0x0) {
            writeMesh(this,mesh);
          }
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_38,&local_3c);
        poVar4 = std::operator<<((ostream *)poVar1,"</");
        poVar4 = std::operator<<(poVar4,(string *)XmlTag::object_abi_cxx11_);
        std::operator<<(poVar4,">");
        std::endl<char,std::char_traits<char>>((ostream *)poVar1);
      }
    }
  }
  return;
}

Assistant:

void D3MFExporter::writeObjects() {
    if ( nullptr == mScene->mRootNode ) {
        return;
    }

    aiNode *root = mScene->mRootNode;
    for ( unsigned int i = 0; i < root->mNumChildren; ++i ) {
        aiNode *currentNode( root->mChildren[ i ] );
        if ( nullptr == currentNode ) {
            continue;
        }
        mModelOutput << "<" << XmlTag::object << " id=\"" << currentNode->mName.C_Str() << "\" type=\"model\">";
        mModelOutput << std::endl;
        for ( unsigned int j = 0; j < currentNode->mNumMeshes; ++j ) {
            aiMesh *currentMesh = mScene->mMeshes[ currentNode->mMeshes[ j ] ];
            if ( nullptr == currentMesh ) {
                continue;
            }
            writeMesh( currentMesh );
        }
        mBuildItems.push_back( i );

        mModelOutput << "</" << XmlTag::object << ">";
        mModelOutput << std::endl;
    }
}